

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O1

void _lws_logv(int filter,char *format,__va_list_tag *vl)

{
  __lws_logv(&log_cx,(lws_log_prepend_cx_t)0x0,(void *)0x0,filter,(char *)0x0,format,vl);
  return;
}

Assistant:

void _lws_logv(int filter, const char *format, va_list vl)
{
	__lws_logv(&log_cx, NULL, NULL, filter, NULL, format, vl);
}